

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

uint anon_unknown.dwarf_e7629::AllocateGlobalVariable
               (ExpressionContext *ctx,SynBase *source,uint alignment,longlong size)

{
  ScopeData *pSVar1;
  ulong uVar2;
  uint uVar3;
  uint result;
  ScopeData *scope;
  longlong size_local;
  uint alignment_local;
  SynBase *source_local;
  ExpressionContext *ctx_local;
  
  if ((alignment & alignment - 1) != 0 || 0x10 < alignment) {
    __assert_fail("(alignment & (alignment - 1)) == 0 && alignment <= 16",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                  ,0x19a,
                  "unsigned int (anonymous namespace)::AllocateGlobalVariable(ExpressionContext &, SynBase *, unsigned int, long long)"
                 );
  }
  pSVar1 = ctx->globalScope;
  uVar3 = GetAlignmentOffset(pSVar1->dataSize,alignment);
  pSVar1->dataSize = (ulong)uVar3 + pSVar1->dataSize;
  uVar2 = pSVar1->dataSize;
  if (0x1000000 < (long)((uVar2 & 0xffffffff) + size)) {
    ExpressionContext::Stop(ctx,source,"ERROR: variable size limit exceeded");
  }
  pSVar1->dataSize = size + pSVar1->dataSize;
  return (uint)uVar2;
}

Assistant:

unsigned AllocateGlobalVariable(ExpressionContext &ctx, SynBase *source, unsigned alignment, long long size)
	{
		assert((alignment & (alignment - 1)) == 0 && alignment <= 16);

		ScopeData *scope = ctx.globalScope;

		scope->dataSize += GetAlignmentOffset(scope->dataSize, alignment);

		unsigned result = unsigned(scope->dataSize);

		if(result + size > (1 << 24))
			ctx.Stop(source, "ERROR: variable size limit exceeded");

		scope->dataSize += size;

		return result;
	}